

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O3

GCproto * lj_bcread_proto(LexState *ls)

{
  char **pp;
  long *plVar1;
  ushort *puVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  LexState *ls_00;
  lua_State *L;
  short sVar6;
  byte bVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  GCproto *pt;
  ulong uVar17;
  GCstr *pGVar18;
  void *pvVar19;
  GCtab *t;
  TValue *pTVar20;
  byte bVar21;
  size_t __n;
  long lVar22;
  char *pcVar23;
  uint32_t hbits;
  GCSize size;
  double *pdVar24;
  uint uVar25;
  byte *pbVar26;
  uint uVar27;
  int iVar28;
  undefined4 *puVar29;
  TValue local_38;
  
  pp = &ls->p;
  pbVar26 = (byte *)ls->p;
  ls->p = (char *)(pbVar26 + 1);
  bVar7 = *pbVar26;
  ls->p = (char *)(pbVar26 + 2);
  bVar21 = pbVar26[1];
  ls->p = (char *)(pbVar26 + 3);
  bVar3 = pbVar26[2];
  ls->p = (char *)(pbVar26 + 4);
  bVar4 = pbVar26[3];
  uVar8 = lj_buf_ruleb128(pp);
  uVar9 = lj_buf_ruleb128(pp);
  uVar10 = lj_buf_ruleb128(pp);
  uVar27 = uVar10 + 1;
  uVar12 = 0;
  uVar13 = 0;
  __n = 0;
  if ((ls->level & 2) == 0) {
    uVar11 = lj_buf_ruleb128(pp);
    uVar12 = 0;
    uVar13 = 0;
    __n = 0;
    if (uVar11 != 0) {
      uVar12 = lj_buf_ruleb128(pp);
      uVar13 = lj_buf_ruleb128(pp);
      __n = (size_t)uVar11;
    }
  }
  uVar25 = (uVar8 + uVar27) * 4 + 0x47 & 0xfffffff8;
  iVar28 = uVar25 + uVar9 * 8;
  uVar14 = ((uint)bVar4 * 2 + 2 & 0xfffffffc) + iVar28;
  size = (int)__n + uVar14;
  pt = (GCproto *)lj_mem_newgco(ls->L,size);
  pt->gct = '\a';
  pt->numparams = bVar21;
  pt->framesize = bVar3;
  pt->sizebc = uVar27;
  lVar22 = (long)&(pt->nextgc).gcptr32 + (ulong)uVar25;
  (pt->k).ptr32 = (uint32_t)lVar22;
  (pt->uv).ptr32 = iVar28 + (int)pt;
  pt->sizekgc = 0;
  pt->sizekn = uVar9;
  pt->sizept = size;
  pt->sizeuv = bVar4;
  pt->flags = bVar7;
  pt->trace = 0;
  (pt->chunkname).gcptr32 = *(uint32_t *)&ls->chunkname;
  *(undefined4 *)(lVar22 + (ulong)(uVar8 + 1) * -4) = 0;
  bVar7 = (bVar7 & 2) >> 1;
  pt[1].nextgc.gcptr32 = (uint)bVar7 + (uint)bVar7 * 2 + (uint)bVar3 * 0x100 + 0x59;
  uVar17 = (ulong)(uVar27 * 4 - 4);
  pcVar23 = ls->p;
  ls->p = pcVar23 + uVar17;
  memcpy(&pt[1].marked,pcVar23,uVar17);
  if ((1 < uVar27) && ((ls->level & 1) != 0)) {
    lVar22 = 0;
    do {
      uVar25 = *(uint *)(&pt[1].marked + lVar22 * 4);
      *(uint *)(&pt[1].marked + lVar22 * 4) =
           uVar25 >> 0x18 | (uVar25 & 0xff0000) >> 8 | (uVar25 & 0xff00) << 8 | uVar25 << 0x18;
      lVar22 = lVar22 + 1;
    } while ((ulong)uVar27 - 1 != lVar22);
  }
  if (bVar4 != 0) {
    pvVar19 = (void *)(ulong)(pt->uv).ptr32;
    pcVar23 = ls->p;
    ls->p = pcVar23 + ((uint)bVar4 + (uint)bVar4);
    memcpy(pvVar19,pcVar23,(ulong)((uint)bVar4 + (uint)bVar4));
    if ((ls->level & 1) != 0) {
      uVar17 = 0;
      do {
        puVar2 = (ushort *)((long)pvVar19 + uVar17 * 2);
        *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
        uVar17 = uVar17 + 1;
      } while (bVar4 != uVar17);
    }
  }
  if (uVar8 != 0) {
    puVar29 = (undefined4 *)((ulong)(pt->k).ptr32 + (ulong)uVar8 * -4);
    uVar11 = 0;
    do {
      uVar15 = lj_buf_ruleb128(pp);
      if (uVar15 < 5) {
        if (uVar15 == 0) {
          ls_00 = (LexState *)ls->L;
          uVar17 = (ls_00->lookaheadval).u64;
          if (uVar17 <= (long)ls->lastline + (ulong)*(uint *)((long)&ls_00->p + 4)) {
            bcread_error(ls_00,(ErrMsg)ls->chunkarg);
          }
          (ls_00->lookaheadval).u64 = uVar17 - 8;
          *puVar29 = *(undefined4 *)(uVar17 - 8);
        }
        else if (uVar15 == 1) {
          uVar16 = lj_buf_ruleb128(pp);
          uVar15 = lj_buf_ruleb128(pp);
          if (uVar15 == 0) {
            hbits = 0;
          }
          else {
            hbits = 1;
            if (uVar15 != 1) {
              uVar27 = 0x1f;
              if (uVar15 - 1 != 0) {
                for (; uVar15 - 1 >> uVar27 == 0; uVar27 = uVar27 - 1) {
                }
              }
              hbits = (uVar27 ^ 0xffffffe0) + 0x21;
            }
          }
          t = lj_tab_new(ls->L,uVar16,hbits);
          if (uVar16 != 0) {
            pTVar20 = (TValue *)(ulong)(t->array).ptr32;
            do {
              bcread_ktabk(ls,pTVar20);
              pTVar20 = pTVar20 + 1;
              uVar16 = uVar16 - 1;
            } while (uVar16 != 0);
          }
          for (; uVar15 != 0; uVar15 = uVar15 - 1) {
            bcread_ktabk(ls,&local_38);
            pTVar20 = lj_tab_set(ls->L,t,&local_38);
            bcread_ktabk(ls,pTVar20);
          }
          *puVar29 = (int)t;
        }
        else {
          L = ls->L;
          sVar6 = (uVar15 != 2) + 0xb;
          if (uVar15 == 4) {
            sVar6 = 0x10;
          }
          pvVar19 = lj_mem_newgco(L,(uint)(uVar15 == 4) * 8 + 0x10);
          *(undefined1 *)((long)pvVar19 + 5) = 10;
          *(short *)((long)pvVar19 + 6) = sVar6;
          plVar1 = (long *)((ulong)(L->glref).ptr32 + 0xe0);
          *plVar1 = *plVar1 + 1;
          *puVar29 = (int)pvVar19;
          uVar16 = lj_buf_ruleb128(pp);
          *(uint32_t *)((long)pvVar19 + 8) = uVar16;
          uVar16 = lj_buf_ruleb128(pp);
          *(uint32_t *)((long)pvVar19 + 0xc) = uVar16;
          if (uVar15 == 4) {
            uVar15 = lj_buf_ruleb128(pp);
            *(uint32_t *)((long)pvVar19 + 0x10) = uVar15;
            uVar15 = lj_buf_ruleb128(pp);
            *(uint32_t *)((long)pvVar19 + 0x14) = uVar15;
          }
        }
      }
      else {
        pcVar23 = ls->p;
        ls->p = pcVar23 + (uVar15 - 5);
        pGVar18 = lj_str_new(ls->L,pcVar23,(ulong)(uVar15 - 5));
        *puVar29 = (int)pGVar18;
      }
      uVar11 = uVar11 + 1;
      puVar29 = puVar29 + 1;
    } while (uVar11 != uVar8);
  }
  pt->sizekgc = uVar8;
  if (uVar9 != 0) {
    pdVar24 = (double *)(ulong)(pt->k).ptr32;
    uVar8 = 0;
    do {
      bVar7 = **pp;
      pbVar26 = (byte *)(*pp + 1);
      uVar27 = (uint)(bVar7 >> 1);
      if ((char)bVar7 < '\0') {
        uVar27 = uVar27 & 0x3f;
        bVar21 = 6;
        do {
          bVar3 = *pbVar26;
          uVar27 = uVar27 | (bVar3 & 0x7f) << (bVar21 & 0x1f);
          pbVar26 = pbVar26 + 1;
          bVar21 = bVar21 + 7;
        } while ((char)bVar3 < '\0');
      }
      *pp = (char *)pbVar26;
      if ((bVar7 & 1) == 0) {
        *pdVar24 = (double)(int)uVar27;
      }
      else {
        *(uint *)pdVar24 = uVar27;
        uVar11 = lj_buf_ruleb128(pp);
        *(uint32_t *)((long)pdVar24 + 4) = uVar11;
      }
      uVar8 = uVar8 + 1;
      pdVar24 = pdVar24 + 1;
    } while (uVar8 != uVar9);
  }
  pt->firstline = uVar12;
  pt->numline = uVar13;
  if ((int)__n == 0) {
    pt->lineinfo = 0;
    pt->uvinfo = 0;
    uVar27 = 0;
  }
  else {
    bVar7 = 2 - ((int)uVar13 < 0x10000);
    if ((int)uVar13 < 0x100) {
      bVar7 = 0;
    }
    uVar17 = (long)&(pt->nextgc).gcptr32 + (ulong)uVar14;
    uVar8 = (uint32_t)uVar17;
    (pt->lineinfo).ptr32 = uVar8;
    (pt->uvinfo).ptr32 = (uVar10 << (bVar7 & 0x1f)) + uVar8;
    pvVar19 = (void *)(uVar17 & 0xffffffff);
    pcVar23 = ls->p;
    ls->p = pcVar23 + __n;
    memcpy(pvVar19,pcVar23,__n);
    if (((ls->level & 1) != 0) && (0xff < pt->numline)) {
      uVar27 = pt->sizebc - 1;
      if ((uint)pt->numline < 0x10000) {
        if (uVar27 != 0) {
          uVar17 = 0;
          do {
            puVar2 = (ushort *)((long)pvVar19 + uVar17 * 2);
            *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
            uVar17 = uVar17 + 1;
          } while (uVar27 != uVar17);
        }
      }
      else if (uVar27 != 0) {
        uVar17 = 0;
        do {
          uVar14 = *(uint *)((long)pvVar19 + uVar17 * 4);
          *(uint *)((long)pvVar19 + uVar17 * 4) =
               uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
          uVar17 = uVar17 + 1;
        } while (uVar27 != uVar17);
      }
    }
    uVar14 = (uint)pt->sizeuv;
    uVar27 = (pt->uvinfo).ptr32;
    pcVar23 = (char *)(ulong)uVar27;
    if (pt->sizeuv != 0) {
      do {
        uVar17 = (ulong)pcVar23 & 0xffffffff;
        do {
          uVar27 = (int)uVar17 + 1;
          uVar17 = (ulong)uVar27;
          cVar5 = *pcVar23;
          pcVar23 = pcVar23 + 1;
        } while (cVar5 != '\0');
        uVar14 = uVar14 - 1;
      } while (uVar14 != 0);
    }
  }
  (pt->varinfo).ptr32 = uVar27;
  lj_memprof_add_proto(pt);
  lj_sysprof_add_proto(pt);
  return pt;
}

Assistant:

GCproto *lj_bcread_proto(LexState *ls)
{
  GCproto *pt;
  MSize framesize, numparams, flags, sizeuv, sizekgc, sizekn, sizebc, sizept;
  MSize ofsk, ofsuv, ofsdbg;
  MSize sizedbg = 0;
  BCLine firstline = 0, numline = 0;

  /* Read prototype header. */
  flags = bcread_byte(ls);
  numparams = bcread_byte(ls);
  framesize = bcread_byte(ls);
  sizeuv = bcread_byte(ls);
  sizekgc = bcread_uleb128(ls);
  sizekn = bcread_uleb128(ls);
  sizebc = bcread_uleb128(ls) + 1;
  if (!(bcread_flags(ls) & BCDUMP_F_STRIP)) {
    sizedbg = bcread_uleb128(ls);
    if (sizedbg) {
      firstline = bcread_uleb128(ls);
      numline = bcread_uleb128(ls);
    }
  }

  /* Calculate total size of prototype including all colocated arrays. */
  sizept = (MSize)sizeof(GCproto) +
	   sizebc*(MSize)sizeof(BCIns) +
	   sizekgc*(MSize)sizeof(GCRef);
  sizept = (sizept + (MSize)sizeof(TValue)-1) & ~((MSize)sizeof(TValue)-1);
  ofsk = sizept; sizept += sizekn*(MSize)sizeof(TValue);
  ofsuv = sizept; sizept += ((sizeuv+1)&~1)*2;
  ofsdbg = sizept; sizept += sizedbg;

  /* Allocate prototype object and initialize its fields. */
  pt = (GCproto *)lj_mem_newgco(ls->L, (MSize)sizept);
  pt->gct = ~LJ_TPROTO;
  pt->numparams = (uint8_t)numparams;
  pt->framesize = (uint8_t)framesize;
  pt->sizebc = sizebc;
  setmref(pt->k, (char *)pt + ofsk);
  setmref(pt->uv, (char *)pt + ofsuv);
  pt->sizekgc = 0;  /* Set to zero until fully initialized. */
  pt->sizekn = sizekn;
  pt->sizept = sizept;
  pt->sizeuv = (uint8_t)sizeuv;
  pt->flags = (uint8_t)flags;
  pt->trace = 0;
  setgcref(pt->chunkname, obj2gco(ls->chunkname));

  /* Close potentially uninitialized gap between bc and kgc. */
  *(uint32_t *)((char *)pt + ofsk - sizeof(GCRef)*(sizekgc+1)) = 0;

  /* Read bytecode instructions and upvalue refs. */
  bcread_bytecode(ls, pt, sizebc);
  bcread_uv(ls, pt, sizeuv);

  /* Read constants. */
  bcread_kgc(ls, pt, sizekgc);
  pt->sizekgc = sizekgc;
  bcread_knum(ls, pt, sizekn);

  /* Read and initialize debug info. */
  pt->firstline = firstline;
  pt->numline = numline;
  if (sizedbg) {
    MSize sizeli = (sizebc-1) << (numline < 256 ? 0 : numline < 65536 ? 1 : 2);
    setmref(pt->lineinfo, (char *)pt + ofsdbg);
    setmref(pt->uvinfo, (char *)pt + ofsdbg + sizeli);
    bcread_dbg(ls, pt, sizedbg);
    setmref(pt->varinfo, bcread_varinfo(pt));
  } else {
    setmref(pt->lineinfo, NULL);
    setmref(pt->uvinfo, NULL);
    setmref(pt->varinfo, NULL);
  }

  /* Add a new prototype to the profiler. */
#if LJ_HASMEMPROF
  lj_memprof_add_proto(pt);
#endif

#if LJ_HASSYSPROF
  lj_sysprof_add_proto(pt);
#endif

  return pt;
}